

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

uint32_t helper_bcdcfz_ppc(ppc_avr_t *r,ppc_avr_t *b,uint32_t ps)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  uint32_t uVar5;
  byte bVar6;
  long lVar7;
  ppc_avr_t local_48;
  
  bVar4 = 3;
  if (ps != 0) {
    bVar4 = 0xf;
  }
  local_48.u64[0] = 0;
  local_48.u64[1] = 0;
  bVar1 = b->u8[0];
  bVar2 = bVar1 < 0xa0 && ps != 0;
  lVar7 = 0;
  while( true ) {
    bVar3 = bVar1;
    bVar6 = bVar4;
    if (lVar7 != 0) {
      if (lVar7 == 0x10) goto LAB_009553b7;
      bVar3 = b->u8[lVar7];
      bVar6 = bVar3 >> 4;
    }
    if ((bVar6 != bVar4) || (9 < (bVar3 & 0xf))) break;
    lVar7 = lVar7 + 1;
    bcd_put_digit(&local_48,bVar3 & 0xf,(int)lVar7);
  }
  bVar2 = true;
LAB_009553b7:
  if (ps == 0) {
    bVar4 = (bVar1 & 0x40) == 0 ^ 0xd;
  }
  else {
    bVar4 = ((bVar1 >> 4) - 0xb & 0xfd) == 0 | 0xc;
  }
  local_48.u8[0] = local_48.u8[0] & 0xf0 | bVar4;
  uVar5 = bcd_cmp_zero(&local_48);
  if (bVar2) {
    uVar5 = 1;
  }
  r->u64[0] = local_48.u64[0];
  r->u64[1] = local_48.u64[1];
  return uVar5;
}

Assistant:

uint32_t helper_bcdcfz(ppc_avr_t *r, ppc_avr_t *b, uint32_t ps)
{
    int i;
    int cr = 0;
    int invalid = 0;
    int zone_digit = 0;
    int zone_lead = ps ? 0xF : 0x3;
    int digit = 0;
    ppc_avr_t ret = { .u64 = { 0, 0 } };
    int sgnb = b->VsrB(BCD_DIG_BYTE(0)) >> 4;

    if (unlikely((sgnb < 0xA) && ps)) {
        invalid = 1;
    }

    for (i = 0; i < 16; i++) {
        zone_digit = i ? b->VsrB(BCD_DIG_BYTE(i * 2)) >> 4 : zone_lead;
        digit = b->VsrB(BCD_DIG_BYTE(i * 2)) & 0xF;
        if (unlikely(zone_digit != zone_lead || digit > 0x9)) {
            invalid = 1;
            break;
        }

        bcd_put_digit(&ret, digit, i + 1);
    }

    if ((ps && (sgnb == 0xB || sgnb == 0xD)) ||
            (!ps && (sgnb & 0x4))) {
        bcd_put_digit(&ret, BCD_NEG_PREF, 0);
    } else {
        bcd_put_digit(&ret, BCD_PLUS_PREF_1, 0);
    }

    cr = bcd_cmp_zero(&ret);

    if (unlikely(invalid)) {
        cr = CRF_SO;
    }

    *r = ret;

    return cr;
}